

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.cpp
# Opt level: O0

void __thiscall
DFATest_CycleRefined_Test::~DFATest_CycleRefined_Test(DFATest_CycleRefined_Test *this)

{
  DFATest_CycleRefined_Test *this_local;
  
  ~DFATest_CycleRefined_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DFATest, CycleRefined) {
  // A and B are distinguishable, so the partitions should be refined.
  State a{"A", {"B"}};
  State b{"B", {"C"}};
  State c{"C", {"A"}};
  Graph graph = {{a, b}, {c}};
  auto results = DFA::refinePartitions(graph);
  validate(graph, results);
  EXPECT_EQ(settify(results), (SetResults{{"A"}, {"B"}, {"C"}}));
}